

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O2

ModuleRunner * __thiscall
wasm::ShellExternalInterface::getImportInstance(ShellExternalInterface *this,Importable *import)

{
  iterator iVar1;
  Fatal *this_00;
  undefined1 local_1a8 [392];
  
  iVar1 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
          ::find(&(this->linkedInstances)._M_t,&import->module);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->linkedInstances)._M_t._M_impl.super__Rb_tree_header) {
    return (ModuleRunner *)iVar1._M_node[1]._M_left;
  }
  Fatal::Fatal((Fatal *)local_1a8);
  std::operator<<((ostream *)(local_1a8 + 0x10),"importGlobals: unknown import: ");
  this_00 = Fatal::operator<<((Fatal *)local_1a8,
                              (basic_string_view<char,_std::char_traits<char>_> *)&import->module);
  std::operator<<((ostream *)&this_00->field_0x10,".");
  Fatal::operator<<(this_00,(basic_string_view<char,_std::char_traits<char>_> *)&import->base);
  Fatal::~Fatal((Fatal *)local_1a8);
}

Assistant:

ModuleRunner* getImportInstance(Importable* import) {
    auto it = linkedInstances.find(import->module);
    if (it == linkedInstances.end()) {
      Fatal() << "importGlobals: unknown import: " << import->module.str << "."
              << import->base.str;
    }
    return it->second.get();
  }